

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# materials.h
# Opt level: O3

void pbrt::Bump<pbrt::UniversalTextureEvaluator>
               (ulong *param_1,Image *param_2,undefined1 (*param_3) [12],undefined8 *param_4,
               undefined8 *param_5)

{
  float fVar1;
  ulong uVar2;
  int iVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined1 auVar6 [16];
  undefined8 uVar7;
  bool bVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  TextureEvalContext ctx;
  TextureEvalContext ctx_00;
  TextureEvalContext ctx_01;
  float fVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  Float FVar15;
  float fVar16;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Dc;
  undefined1 auVar17 [16];
  undefined4 extraout_XMM0_Dd;
  undefined1 auVar18 [64];
  float fVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  float fVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  float fVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  float fVar37;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  float fVar40;
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  UniversalTextureEvaluator local_169;
  undefined8 local_168;
  undefined4 local_160;
  undefined8 local_158;
  undefined4 local_150;
  undefined1 local_148 [16];
  undefined1 local_138 [16];
  Float local_128;
  float local_118;
  undefined4 uStack_114;
  undefined4 uStack_110;
  undefined4 uStack_10c;
  undefined8 local_108;
  undefined4 uStack_100;
  undefined4 uStack_fc;
  undefined4 uStack_f8;
  undefined4 uStack_f4;
  undefined8 uStack_f0;
  undefined4 uStack_e8;
  undefined4 uStack_e4;
  undefined4 uStack_e0;
  undefined4 uStack_dc;
  undefined4 uStack_d8;
  undefined4 uStack_d4;
  undefined4 uStack_d0;
  int iStack_cc;
  undefined8 local_c8;
  float fStack_c0;
  undefined4 uStack_bc;
  undefined4 uStack_b8;
  undefined4 uStack_b4;
  undefined8 uStack_b0;
  undefined4 uStack_a8;
  undefined4 uStack_a4;
  undefined4 uStack_a0;
  undefined4 uStack_9c;
  undefined4 uStack_98;
  undefined4 uStack_94;
  undefined4 uStack_90;
  int iStack_8c;
  undefined8 local_88;
  float fStack_80;
  undefined8 uStack_7c;
  undefined4 uStack_74;
  undefined8 uStack_70;
  undefined4 uStack_68;
  undefined8 uStack_64;
  undefined1 auStack_5c [16];
  int iStack_4c;
  ulong local_48;
  ulong local_40;
  ulong local_38;
  undefined1 extraout_var [60];
  
  local_38 = *param_1;
  if ((local_38 & 0xffffffffffff) == 0) {
    local_148 = vinsertps_avx(*(undefined1 (*) [16])(param_3 + 1),
                              ZEXT416((uint)(1.0 - *(float *)(param_3[1] + 4))),0x10);
    local_118 = Image::BilerpChannel(param_2,(Point2f)local_148._0_8_,0,(WrapMode2D)0x0);
    uStack_114 = extraout_XMM0_Db;
    uStack_110 = extraout_XMM0_Dc;
    uStack_10c = extraout_XMM0_Dd;
    local_128 = Image::BilerpChannel(param_2,(Point2f)local_148._0_8_,1,(WrapMode2D)0x0);
    auVar18._0_4_ = Image::BilerpChannel(param_2,(Point2f)local_148._0_8_,2,(WrapMode2D)0x0);
    auVar18._4_60_ = extraout_var;
    auVar13._8_4_ = 0x80000000;
    auVar13._0_8_ = 0x8000000080000000;
    auVar13._12_4_ = 0x80000000;
    auVar38._8_4_ = 0x3f800000;
    auVar38._0_8_ = 0x3f8000003f800000;
    auVar38._12_4_ = 0x3f800000;
    fVar1 = *(float *)(param_3[2] + 4);
    uVar2 = *(ulong *)(param_3[1] + 8);
    auVar30._8_8_ = 0;
    auVar30._0_8_ = uVar2;
    auVar44._8_4_ = 0x40000000;
    auVar44._0_8_ = 0x4000000040000000;
    auVar44._12_4_ = 0x40000000;
    auVar46._8_4_ = 0x3f800000;
    auVar46._0_8_ = 0x3f8000003f800000;
    auVar46._12_4_ = 0x3f800000;
    auVar12 = vfmadd132ss_fma(auVar18._0_16_,SUB6416(ZEXT464(0xbf800000),0),ZEXT416(0x40000000));
    fVar11 = (float)*(undefined8 *)param_3[4];
    fVar24 = (float)((ulong)*(undefined8 *)param_3[4] >> 0x20);
    auVar41._0_4_ = fVar11 * fVar11;
    auVar41._4_4_ = fVar24 * fVar24;
    auVar41._8_8_ = 0;
    auVar13 = vpternlogd_avx512vl(auVar38,ZEXT416((uint)fVar1),auVar13,0xf8);
    fVar37 = auVar13._0_4_;
    auVar31 = vunpcklps_avx(auVar46,auVar13);
    fVar16 = auVar12._0_4_;
    auVar34._0_4_ = -1.0 / (fVar37 + fVar1);
    auVar13 = vmovshdup_avx(auVar30);
    fVar27 = (float)uVar2;
    fVar11 = *(float *)(param_3[3] + 4);
    auVar30 = vmovshdup_avx(auVar41);
    auVar12._4_4_ = uStack_114;
    auVar12._0_4_ = local_118;
    auVar12._8_4_ = uStack_110;
    auVar12._12_4_ = uStack_10c;
    auVar12 = vinsertps_avx(auVar12,ZEXT416((uint)local_128),0x10);
    auVar6._8_4_ = 0xbf800000;
    auVar6._0_8_ = 0xbf800000bf800000;
    auVar6._12_4_ = 0xbf800000;
    auVar14 = vfmadd213ps_avx512vl(auVar44,auVar12,auVar6);
    auVar12 = ZEXT416((uint)(auVar30._0_4_ +
                            auVar41._0_4_ + *(float *)(param_3[3] + 8) * *(float *)(param_3[3] + 8))
                     );
    auVar6 = vsqrtss_avx(auVar12,auVar12);
    auVar42._0_4_ = auVar14._0_4_ * auVar14._0_4_;
    auVar42._4_4_ = auVar14._4_4_ * auVar14._4_4_;
    auVar42._8_4_ = auVar14._8_4_ * auVar14._8_4_;
    auVar42._12_4_ = auVar14._12_4_ * auVar14._12_4_;
    auVar12 = vhaddps_avx(auVar42,auVar42);
    auVar12 = ZEXT416((uint)(auVar12._0_4_ + fVar16 * fVar16));
    auVar12 = vsqrtss_avx(auVar12,auVar12);
    fVar24 = auVar12._0_4_;
    auVar43._4_4_ = fVar24;
    auVar43._0_4_ = fVar24;
    auVar43._8_4_ = fVar24;
    auVar43._12_4_ = fVar24;
    fVar16 = fVar16 / fVar24;
    fVar19 = fVar27 * auVar13._0_4_ * auVar34._0_4_;
    auVar34._4_4_ = auVar34._0_4_;
    auVar34._8_4_ = auVar34._0_4_;
    auVar34._12_4_ = auVar34._0_4_;
    auVar12 = vdivps_avx(auVar14,auVar43);
    auVar45._0_4_ = fVar27 * fVar37 * fVar27;
    fVar24 = (float)(uVar2 >> 0x20);
    auVar45._4_4_ = fVar24 * 0.0;
    auVar45._8_8_ = 0;
    auVar31 = vfmadd231ps_fma(auVar31,auVar45,auVar34);
    fVar40 = auVar12._0_4_;
    auVar14 = vpermi2ps_avx512vl(_DAT_02865280,ZEXT416((uint)(fVar37 * fVar19)),
                                 ZEXT416((uint)fVar19));
    auVar30 = vshufps_avx(auVar12,auVar12,0xe1);
    auVar35._0_4_ = fVar40 * fVar27;
    auVar35._4_4_ = auVar12._4_4_ * fVar24;
    auVar35._8_4_ = auVar12._8_4_ * 0.0;
    auVar35._12_4_ = auVar12._12_4_ * 0.0;
    auVar13 = vmovshdup_avx(auVar35);
    fVar1 = fVar1 * fVar16 + (fVar40 * fVar27 * -fVar37 - auVar13._0_4_);
    auVar26._0_4_ = fVar27 * fVar16 + fVar40 * auVar31._0_4_ + auVar30._0_4_ * auVar14._0_4_;
    auVar26._4_4_ = fVar24 * fVar16 + auVar12._4_4_ * auVar31._4_4_ + auVar30._4_4_ * auVar14._4_4_;
    auVar26._8_4_ = fVar16 * 0.0 + auVar12._8_4_ * auVar31._8_4_ + auVar30._8_4_ * auVar14._8_4_;
    auVar26._12_4_ =
         fVar16 * 0.0 + auVar12._12_4_ * auVar31._12_4_ + auVar30._12_4_ * auVar14._12_4_;
    auVar31._8_8_ = 0;
    auVar31._0_8_ = *(ulong *)(param_3[2] + 8);
    auVar12 = vmovshdup_avx(auVar31);
    fVar24 = (float)*(ulong *)(param_3[2] + 8);
    fVar19 = auVar12._0_4_;
    auVar13 = vmovshdup_avx(auVar26);
    auVar12 = vfmadd231ss_fma(ZEXT416((uint)(fVar19 * auVar13._0_4_)),auVar31,auVar26);
    auVar30 = ZEXT416((uint)(fVar11 * fVar11 + fVar24 * fVar24 + fVar19 * fVar19));
    auVar30 = vsqrtss_avx(auVar30,auVar30);
    auVar12 = vfmadd231ss_fma(auVar12,ZEXT416((uint)fVar11),ZEXT416((uint)fVar1));
    fVar24 = auVar12._0_4_;
    auVar14._0_4_ = auVar26._0_4_ * fVar24;
    auVar14._4_4_ = auVar26._4_4_ * fVar24;
    auVar14._8_4_ = auVar26._8_4_ * fVar24;
    auVar14._12_4_ = auVar26._12_4_ * fVar24;
    fVar11 = fVar11 - fVar1 * fVar24;
    auVar31 = vsubps_avx(auVar31,auVar14);
    auVar36._0_4_ = auVar31._0_4_ * auVar31._0_4_;
    auVar36._4_4_ = auVar31._4_4_ * auVar31._4_4_;
    auVar36._8_4_ = auVar31._8_4_ * auVar31._8_4_;
    auVar36._12_4_ = auVar31._12_4_ * auVar31._12_4_;
    auVar12 = vhaddps_avx(auVar36,auVar36);
    auVar12 = ZEXT416((uint)(fVar11 * fVar11 + auVar12._0_4_));
    auVar12 = vsqrtss_avx(auVar12,auVar12);
    fVar19 = auVar12._0_4_;
    auVar39._4_4_ = fVar19;
    auVar39._0_4_ = fVar19;
    auVar39._8_4_ = fVar19;
    auVar39._12_4_ = fVar19;
    fVar24 = auVar30._0_4_;
    auVar12 = vdivps_avx(auVar31,auVar39);
    fVar11 = fVar24 * (fVar11 / fVar19);
    auVar32._0_4_ = fVar24 * auVar12._0_4_;
    auVar32._4_4_ = fVar24 * auVar12._4_4_;
    auVar32._8_4_ = fVar24 * auVar12._8_4_;
    auVar32._12_4_ = fVar24 * auVar12._12_4_;
    auVar12 = vmovshdup_avx(auVar32);
    uVar7 = vmovlps_avx(auVar32);
    *param_4 = uVar7;
    *(float *)(param_4 + 1) = fVar11;
    auVar14 = vfnmadd213ss_fma(ZEXT416((uint)fVar11),auVar26,ZEXT416((uint)(auVar26._0_4_ * fVar11))
                              );
    auVar31 = ZEXT416((uint)(fVar1 * auVar12._0_4_));
    auVar30 = vfmsub213ss_fma(ZEXT416((uint)fVar11),auVar13,auVar31);
    auVar34 = vfnmadd231ss_fma(auVar31,ZEXT416((uint)fVar1),auVar12);
    auVar31 = vfmsub213ss_fma(ZEXT416((uint)fVar1),auVar32,ZEXT416((uint)(auVar26._0_4_ * fVar11)));
    fVar1 = auVar31._0_4_ + auVar14._0_4_;
    fVar24 = auVar30._0_4_ + auVar34._0_4_;
    auVar30 = ZEXT416((uint)(auVar13._0_4_ * auVar32._0_4_));
    auVar12 = vfmsub213ss_fma(auVar12,auVar26,auVar30);
    auVar13 = vfnmadd213ss_fma(auVar32,auVar13,auVar30);
    fVar19 = auVar12._0_4_ + auVar13._0_4_;
    auVar12 = ZEXT416((uint)(fVar19 * fVar19 + fVar24 * fVar24 + fVar1 * fVar1));
    auVar12 = vsqrtss_avx(auVar12,auVar12);
    fVar16 = auVar12._0_4_;
    fVar11 = auVar6._0_4_;
    auVar12 = vinsertps_avx(ZEXT416((uint)(fVar11 * (fVar24 / fVar16))),
                            ZEXT416((uint)(fVar11 * (fVar1 / fVar16))),0x10);
    fVar11 = fVar11 * (fVar19 / fVar16);
    uVar7 = vmovlps_avx(auVar12);
    *param_5 = uVar7;
  }
  else {
    local_150 = *(undefined4 *)(param_3[8] + 8);
    iVar3 = *(int *)param_3[10];
    local_158 = *(undefined8 *)param_3[8];
    local_168 = *(undefined8 *)param_3[9];
    local_160 = *(undefined4 *)(param_3[9] + 8);
    uStack_74 = *(undefined4 *)(param_3[8] + 8);
    uVar4 = *(undefined8 *)param_3[8];
    uVar5 = *(undefined8 *)param_3[9];
    uStack_68 = *(undefined4 *)(param_3[9] + 8);
    local_138 = *(undefined1 (*) [16])(param_3[6] + 8);
    auVar9._8_4_ = 0x7fffffff;
    auVar9._0_8_ = 0x7fffffff7fffffff;
    auVar9._12_4_ = 0x7fffffff;
    auVar12 = vandps_avx512vl(local_138,auVar9);
    auVar12 = vhaddps_avx(auVar12,auVar12);
    fVar11 = auVar12._0_4_ * 0.5;
    uVar7 = vcmpss_avx512f(ZEXT416((uint)fVar11),ZEXT816(0) << 0x20,0);
    bVar8 = (bool)((byte)uVar7 & 1);
    fVar11 = (float)((uint)bVar8 * 0x3a03126f + (uint)!bVar8 * (int)fVar11);
    local_148 = ZEXT416((uint)fVar11);
    fStack_80 = fVar11 * *(float *)(param_3[3] + 4) + *(float *)(*param_3 + 8);
    auVar20._0_4_ = fVar11 * (float)*(undefined8 *)(param_3[2] + 8) + (float)*(undefined8 *)*param_3
    ;
    auVar20._4_4_ =
         fVar11 * (float)((ulong)*(undefined8 *)(param_3[2] + 8) >> 0x20) +
         (float)((ulong)*(undefined8 *)*param_3 >> 0x20);
    auVar20._8_4_ = fVar11 * 0.0 + 0.0;
    auVar20._12_4_ = fVar11 * 0.0 + 0.0;
    auVar25._0_4_ = fVar11 + (float)*(undefined8 *)param_3[1];
    auVar25._4_4_ = (float)((ulong)*(undefined8 *)param_3[1] >> 0x20) + 0.0;
    auVar25._8_8_ = 0;
    local_88 = vmovlps_avx(auVar20);
    uVar7 = vmovlps_avx(auVar25);
    uStack_7c._0_4_ = (undefined4)uVar4;
    uStack_7c._4_4_ = (undefined4)((ulong)uVar4 >> 0x20);
    uStack_70._0_4_ = (undefined4)uVar5;
    uStack_70._4_4_ = (undefined4)((ulong)uVar5 >> 0x20);
    uStack_64._0_4_ = (undefined4)uVar7;
    uStack_64._4_4_ = (undefined4)((ulong)uVar7 >> 0x20);
    auStack_5c._0_4_ = local_138._0_4_;
    auStack_5c._4_4_ = local_138._4_4_;
    auStack_5c._8_4_ = local_138._8_4_;
    auStack_5c._12_4_ = local_138._12_4_;
    ctx.p.super_Tuple3<pbrt::Point3,_float>.z = fStack_80;
    ctx.p.super_Tuple3<pbrt::Point3,_float>.x = (float)(int)local_88;
    ctx.p.super_Tuple3<pbrt::Point3,_float>.y = (float)(int)((ulong)local_88 >> 0x20);
    ctx.dpdx.super_Tuple3<pbrt::Vector3,_float>.x = (float)(undefined4)uStack_7c;
    ctx.dpdx.super_Tuple3<pbrt::Vector3,_float>.y = (float)uStack_7c._4_4_;
    ctx.dpdx.super_Tuple3<pbrt::Vector3,_float>.z = (float)uStack_74;
    ctx.dpdy.super_Tuple3<pbrt::Vector3,_float>.x = (float)(undefined4)uStack_70;
    ctx.dpdy.super_Tuple3<pbrt::Vector3,_float>.y = (float)uStack_70._4_4_;
    ctx.dpdy.super_Tuple3<pbrt::Vector3,_float>.z = (float)uStack_68;
    ctx.uv.super_Tuple2<pbrt::Point2,_float>.x = (float)(undefined4)uStack_64;
    ctx.uv.super_Tuple2<pbrt::Point2,_float>.y = (float)uStack_64._4_4_;
    ctx.dudx = (Float)auStack_5c._0_4_;
    ctx.dudy = (Float)auStack_5c._4_4_;
    ctx.dvdx = (Float)auStack_5c._8_4_;
    ctx.dvdy = (Float)auStack_5c._12_4_;
    ctx.faceIndex = iVar3;
    uStack_7c = uVar4;
    uStack_70 = uVar5;
    uStack_64 = uVar7;
    auStack_5c = local_138;
    iStack_4c = iVar3;
    local_128 = UniversalTextureEvaluator::operator()(&local_169,(FloatTextureHandle)&local_38,ctx);
    auVar28._8_8_ = 0;
    auVar28._0_8_ = *(ulong *)(param_3[7] + 4);
    auVar10._8_4_ = 0x7fffffff;
    auVar10._0_8_ = 0x7fffffff7fffffff;
    auVar10._12_4_ = 0x7fffffff;
    auVar12 = vandps_avx512vl(auVar28,auVar10);
    auVar12 = vhaddps_avx(auVar12,auVar12);
    fVar11 = auVar12._0_4_ * 0.5;
    uVar7 = vcmpss_avx512f(ZEXT416((uint)fVar11),ZEXT416(0),0);
    bVar8 = (bool)((byte)uVar7 & 1);
    local_40 = *param_1;
    local_118 = (float)((uint)bVar8 * 0x3a03126f + (uint)!bVar8 * (int)fVar11);
    uStack_114 = 0;
    uStack_110 = 0;
    uStack_10c = 0;
    auVar33._4_4_ = local_118;
    auVar33._0_4_ = local_118;
    auVar33._8_4_ = local_118;
    auVar33._12_4_ = local_118;
    fStack_c0 = local_118 * *(float *)(param_3[4] + 4) + *(float *)(*param_3 + 8);
    auVar17._0_4_ =
         (float)*(undefined8 *)*param_3 + (float)*(undefined8 *)(param_3[3] + 8) * local_118;
    auVar17._4_4_ =
         (float)((ulong)*(undefined8 *)*param_3 >> 0x20) +
         (float)((ulong)*(undefined8 *)(param_3[3] + 8) >> 0x20) * local_118;
    auVar17._8_4_ = local_118 * 0.0 + 0.0;
    auVar17._12_4_ = local_118 * 0.0 + 0.0;
    local_c8 = vmovlps_avx(auVar17);
    auVar29._0_12_ = ZEXT812(0);
    auVar29._12_4_ = 0;
    auVar12 = vblendps_avx(auVar33,auVar29,0xd);
    auVar21._0_4_ = auVar12._0_4_ + (float)*(undefined8 *)param_3[1];
    auVar21._4_4_ = auVar12._4_4_ + (float)((ulong)*(undefined8 *)param_3[1] >> 0x20);
    auVar21._8_4_ = auVar12._8_4_ + 0.0;
    auVar21._12_4_ = auVar12._12_4_ + 0.0;
    uStack_bc = (undefined4)local_158;
    uStack_b8 = (undefined4)((ulong)local_158 >> 0x20);
    uStack_b4 = local_150;
    uStack_a8 = local_160;
    uStack_b0 = local_168;
    uVar7 = vmovlps_avx(auVar21);
    uStack_a4 = (undefined4)uVar7;
    uStack_a0 = (undefined4)((ulong)uVar7 >> 0x20);
    uStack_9c = local_138._0_4_;
    uStack_98 = local_138._4_4_;
    uStack_94 = local_138._8_4_;
    uStack_90 = local_138._12_4_;
    ctx_00.p.super_Tuple3<pbrt::Point3,_float>.z = fStack_c0;
    ctx_00.p.super_Tuple3<pbrt::Point3,_float>.x = (float)(int)local_c8;
    ctx_00.p.super_Tuple3<pbrt::Point3,_float>.y = (float)(int)((ulong)local_c8 >> 0x20);
    ctx_00.dpdx.super_Tuple3<pbrt::Vector3,_float>.x = (float)uStack_bc;
    ctx_00.dpdx.super_Tuple3<pbrt::Vector3,_float>.y = (float)uStack_b8;
    ctx_00.dpdx.super_Tuple3<pbrt::Vector3,_float>.z = (float)local_150;
    ctx_00.dpdy.super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)local_168;
    ctx_00.dpdy.super_Tuple3<pbrt::Vector3,_float>.y = (float)(int)((ulong)local_168 >> 0x20);
    ctx_00.dpdy.super_Tuple3<pbrt::Vector3,_float>.z = (float)local_160;
    ctx_00.uv.super_Tuple2<pbrt::Point2,_float>.x = (float)uStack_a4;
    ctx_00.uv.super_Tuple2<pbrt::Point2,_float>.y = (float)uStack_a0;
    ctx_00.dudx = (Float)uStack_9c;
    ctx_00.dudy = (Float)uStack_98;
    ctx_00.dvdx = (Float)uStack_94;
    ctx_00.dvdy = (Float)uStack_90;
    ctx_00.faceIndex = iVar3;
    iStack_8c = iVar3;
    FVar15 = UniversalTextureEvaluator::operator()(&local_169,(FloatTextureHandle)&local_40,ctx_00);
    local_48 = *param_1;
    local_138._0_4_ = FVar15;
    uStack_100 = *(undefined4 *)(*param_3 + 8);
    iStack_cc = *(int *)param_3[10];
    local_108 = *(undefined8 *)*param_3;
    uStack_f4 = *(undefined4 *)(param_3[8] + 8);
    uStack_fc = (undefined4)*(undefined8 *)param_3[8];
    uStack_f8 = (undefined4)((ulong)*(undefined8 *)param_3[8] >> 0x20);
    uStack_e8 = *(undefined4 *)(param_3[9] + 8);
    uStack_f0 = *(undefined8 *)param_3[9];
    uStack_e4 = (undefined4)*(undefined8 *)param_3[1];
    uStack_e0 = (undefined4)((ulong)*(undefined8 *)param_3[1] >> 0x20);
    uStack_dc = (undefined4)*(undefined8 *)(param_3[6] + 8);
    uStack_d8 = (undefined4)((ulong)*(undefined8 *)(param_3[6] + 8) >> 0x20);
    uStack_d4 = (undefined4)*(undefined8 *)(param_3[7] + 4);
    uStack_d0 = (undefined4)((ulong)*(undefined8 *)(param_3[7] + 4) >> 0x20);
    ctx_01.dpdx.super_Tuple3<pbrt::Vector3,_float>.x = (float)uStack_fc;
    ctx_01.p.super_Tuple3<pbrt::Point3,_float> = (Tuple3<pbrt::Point3,_float>)*param_3;
    ctx_01.dpdx.super_Tuple3<pbrt::Vector3,_float>.y = (float)uStack_f8;
    ctx_01.dpdx.super_Tuple3<pbrt::Vector3,_float>.z = (float)uStack_f4;
    ctx_01.dpdy.super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)uStack_f0;
    ctx_01.dpdy.super_Tuple3<pbrt::Vector3,_float>.y = (float)(int)((ulong)uStack_f0 >> 0x20);
    ctx_01.dpdy.super_Tuple3<pbrt::Vector3,_float>.z = (float)uStack_e8;
    ctx_01.uv.super_Tuple2<pbrt::Point2,_float>.x = (float)uStack_e4;
    ctx_01.uv.super_Tuple2<pbrt::Point2,_float>.y = (float)uStack_e0;
    ctx_01.dudx = (Float)uStack_dc;
    ctx_01.dudy = (Float)uStack_d8;
    ctx_01.dvdx = (Float)uStack_d4;
    ctx_01.dvdy = (Float)uStack_d0;
    ctx_01.faceIndex = iStack_cc;
    FVar15 = UniversalTextureEvaluator::operator()(&local_169,(FloatTextureHandle)&local_48,ctx_01);
    fVar11 = *(float *)(param_3[5] + 4);
    fVar19 = (local_128 - FVar15) / (float)local_148._0_4_;
    fVar1 = *(float *)(param_3[2] + 4);
    fVar24 = *(float *)(param_3[3] + 4);
    auVar22._0_4_ =
         (float)*(undefined8 *)(param_3[1] + 8) * fVar19 + (float)*(undefined8 *)(param_3[2] + 8) +
         FVar15 * (float)*(undefined8 *)(param_3[4] + 8);
    auVar22._4_4_ =
         (float)((ulong)*(undefined8 *)(param_3[1] + 8) >> 0x20) * fVar19 +
         (float)((ulong)*(undefined8 *)(param_3[2] + 8) >> 0x20) +
         FVar15 * (float)((ulong)*(undefined8 *)(param_3[4] + 8) >> 0x20);
    auVar22._8_4_ = fVar19 * 0.0 + 0.0 + FVar15 * 0.0;
    auVar22._12_4_ = fVar19 * 0.0 + 0.0 + FVar15 * 0.0;
    uVar7 = vmovlps_avx(auVar22);
    *param_4 = uVar7;
    *(float *)(param_4 + 1) = fVar19 * fVar1 + fVar24 + FVar15 * fVar11;
    local_118 = ((float)local_138._0_4_ - FVar15) / local_118;
    fVar11 = local_118 * *(float *)(param_3[2] + 4) + *(float *)(param_3[4] + 4) +
             FVar15 * *(float *)(param_3[6] + 4);
    auVar23._0_4_ =
         local_118 * (float)*(undefined8 *)(param_3[1] + 8) + (float)*(undefined8 *)(param_3[3] + 8)
         + FVar15 * (float)*(undefined8 *)(param_3[5] + 8);
    auVar23._4_4_ =
         local_118 * (float)((ulong)*(undefined8 *)(param_3[1] + 8) >> 0x20) +
         (float)((ulong)*(undefined8 *)(param_3[3] + 8) >> 0x20) +
         FVar15 * (float)((ulong)*(undefined8 *)(param_3[5] + 8) >> 0x20);
    auVar23._8_4_ = local_118 * 0.0 + 0.0 + FVar15 * 0.0;
    auVar23._12_4_ = local_118 * 0.0 + 0.0 + FVar15 * 0.0;
    uVar7 = vmovlps_avx(auVar23);
    *param_5 = uVar7;
  }
  *(float *)(param_5 + 1) = fVar11;
  return;
}

Assistant:

PBRT_CPU_GPU void Bump(TextureEvaluator texEval, FloatTextureHandle displacement,
                       const Image *normalMap, const BumpEvalContext &ctx, Vector3f *dpdu,
                       Vector3f *dpdv) {
    DCHECK(displacement != nullptr || normalMap != nullptr);
    if (displacement) {
        if (displacement)
            DCHECK(texEval.CanEvaluate({displacement}, {}));
        // Compute offset positions and evaluate displacement texture
        TextureEvalContext shiftedCtx = ctx;
        // Shift _shiftedCtx_ _du_ in the $u$ direction
        Float du = .5f * (std::abs(ctx.dudx) + std::abs(ctx.dudy));
        if (du == 0)
            du = .0005f;
        shiftedCtx.p = ctx.p + du * ctx.shading.dpdu;
        shiftedCtx.uv = ctx.uv + Vector2f(du, 0.f);

        Float uDisplace = texEval(displacement, shiftedCtx);
        // Shift _shiftedCtx_ _dv_ in the $v$ direction
        Float dv = .5f * (std::abs(ctx.dvdx) + std::abs(ctx.dvdy));
        if (dv == 0)
            dv = .0005f;
        shiftedCtx.p = ctx.p + dv * ctx.shading.dpdv;
        shiftedCtx.uv = ctx.uv + Vector2f(0.f, dv);

        Float vDisplace = texEval(displacement, shiftedCtx);
        Float displace = texEval(displacement, ctx);

        // Compute bump-mapped differential geometry
        *dpdu = ctx.shading.dpdu + (uDisplace - displace) / du * Vector3f(ctx.shading.n) +
                displace * Vector3f(ctx.shading.dndu);
        *dpdv = ctx.shading.dpdv + (vDisplace - displace) / dv * Vector3f(ctx.shading.n) +
                displace * Vector3f(ctx.shading.dndv);

    } else {
        // Sample normal map to compute shading normal
        WrapMode2D wrap(WrapMode::Repeat);
        Point2f uv(ctx.uv[0], 1 - ctx.uv[1]);
        Vector3f ns(2 * normalMap->BilerpChannel(uv, 0, wrap) - 1,
                    2 * normalMap->BilerpChannel(uv, 1, wrap) - 1,
                    2 * normalMap->BilerpChannel(uv, 2, wrap) - 1);
        ns = Normalize(ns);
        Frame frame = Frame::FromZ(ctx.shading.n);
        ns = frame.FromLocal(ns);

        Float ulen = Length(ctx.shading.dpdu), vlen = Length(ctx.shading.dpdv);
        *dpdu = Normalize(GramSchmidt(ctx.shading.dpdu, ns)) * ulen;
        *dpdv = Normalize(Cross(ns, *dpdu)) * vlen;
    }
}